

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O0

void __thiscall Gluco::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  uint *puVar4;
  Clause *pCVar5;
  char *pcVar6;
  vec<unsigned_int> *this_00;
  vec<unsigned_int> *cs;
  int j;
  int i;
  SimpSolver *this_local;
  
  if (this->n_touched != 0) {
    cs._0_4_ = 0;
    _j = this;
    for (cs._4_4_ = 0; iVar1 = cs._4_4_, iVar2 = Queue<unsigned_int>::size(&this->subsumption_queue)
        , iVar1 < iVar2; cs._4_4_ = cs._4_4_ + 1) {
      puVar4 = Queue<unsigned_int>::operator[](&this->subsumption_queue,cs._4_4_);
      pCVar5 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar4);
      uVar3 = Clause::mark(pCVar5);
      if (uVar3 == 0) {
        puVar4 = Queue<unsigned_int>::operator[](&this->subsumption_queue,cs._4_4_);
        pCVar5 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar4);
        Clause::mark(pCVar5,2);
      }
    }
    for (cs._4_4_ = 0; iVar1 = cs._4_4_, iVar2 = vec<char>::size(&this->touched), iVar1 < iVar2;
        cs._4_4_ = cs._4_4_ + 1) {
      pcVar6 = vec<char>::operator[](&this->touched,cs._4_4_);
      if (*pcVar6 != '\0') {
        this_00 = OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::lookup
                            (&this->occurs,(int *)((long)&cs + 4));
        for (cs._0_4_ = 0; iVar1 = (int)cs, iVar2 = vec<unsigned_int>::size(this_00), iVar1 < iVar2;
            cs._0_4_ = (int)cs + 1) {
          puVar4 = vec<unsigned_int>::operator[](this_00,(int)cs);
          pCVar5 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar4);
          uVar3 = Clause::mark(pCVar5);
          if (uVar3 == 0) {
            puVar4 = vec<unsigned_int>::operator[](this_00,(int)cs);
            Queue<unsigned_int>::insert(&this->subsumption_queue,*puVar4);
            puVar4 = vec<unsigned_int>::operator[](this_00,(int)cs);
            pCVar5 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar4);
            Clause::mark(pCVar5,2);
          }
        }
        pcVar6 = vec<char>::operator[](&this->touched,cs._4_4_);
        *pcVar6 = '\0';
      }
    }
    for (cs._4_4_ = 0; iVar1 = cs._4_4_, iVar2 = Queue<unsigned_int>::size(&this->subsumption_queue)
        , iVar1 < iVar2; cs._4_4_ = cs._4_4_ + 1) {
      puVar4 = Queue<unsigned_int>::operator[](&this->subsumption_queue,cs._4_4_);
      pCVar5 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar4);
      uVar3 = Clause::mark(pCVar5);
      if (uVar3 == 2) {
        puVar4 = Queue<unsigned_int>::operator[](&this->subsumption_queue,cs._4_4_);
        pCVar5 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar4);
        Clause::mark(pCVar5,0);
      }
    }
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < touched.size(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}